

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.hpp
# Opt level: O0

void __thiscall
ranger::event::tcp_connection::tcp_connection(tcp_connection *this,tcp_connection *rhs)

{
  tcp_connection *rhs_local;
  tcp_connection *this_local;
  
  this->m_top_bev = rhs->m_top_bev;
  this->m_base_bev = rhs->m_base_bev;
  std::shared_ptr<const_ranger::event::token_bucket_cfg>::shared_ptr
            (&this->m_token_bucket,&rhs->m_token_bucket);
  std::function<void_(ranger::event::tcp_connection_&,_ranger::event::tcp_connection::event_code)>::
  function(&this->m_event_handler,&rhs->m_event_handler);
  this->m_extra_data = rhs->m_extra_data;
  ranger::event::tcp_connection::reset_callbacks();
  rhs->m_top_bev = (bufferevent *)0x0;
  rhs->m_base_bev = (bufferevent *)0x0;
  rhs->m_extra_data = (void *)0x0;
  return;
}

Assistant:

tcp_connection(tcp_connection&& rhs) noexcept
		: m_top_bev(rhs.m_top_bev)
		, m_base_bev(rhs.m_base_bev)
		, m_token_bucket(std::move(rhs.m_token_bucket))
		, m_event_handler(std::move(rhs.m_event_handler))
		, m_extra_data(rhs.m_extra_data) {
		reset_callbacks();
		rhs.m_top_bev = nullptr;
		rhs.m_base_bev = nullptr;
		rhs.m_extra_data = nullptr;
	}